

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>_>_>
* nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator>
  ::
  create<std::vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator>>>,__gnu_cxx::__normal_iterator<TURNCODE_const*,std::vector<TURNCODE,std::allocator<TURNCODE>>>,__gnu_cxx::__normal_iterator<TURNCODE_const*,std::vector<TURNCODE,std::allocator<TURNCODE>>>>
            (__normal_iterator<const_TURNCODE_*,_std::vector<TURNCODE,_std::allocator<TURNCODE>_>_>
             *args,__normal_iterator<const_TURNCODE_*,_std::vector<TURNCODE,_std::allocator<TURNCODE>_>_>
                   *args_1)

{
  vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator>>>
  *this;
  allocator_type local_19;
  
  this = (vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator>>>
          *)operator_new(0x18);
  std::
  vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator>>>
  ::
  vector<__gnu_cxx::__normal_iterator<TURNCODE_const*,std::vector<TURNCODE,std::allocator<TURNCODE>>>,void>
            (this,(__normal_iterator<const_TURNCODE_*,_std::vector<TURNCODE,_std::allocator<TURNCODE>_>_>
                   )args->_M_current,
             (__normal_iterator<const_TURNCODE_*,_std::vector<TURNCODE,_std::allocator<TURNCODE>_>_>
             )args_1->_M_current,&local_19);
  return (vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>_>_>
          *)this;
}

Assistant:

static T* create(Args&& ... args)
        {
            AllocatorType<T> alloc;
            auto deleter = [&](T * object)
            {
                alloc.deallocate(object, 1);
            };
            std::unique_ptr<T, decltype(deleter)> object(alloc.allocate(1), deleter);
            alloc.construct(object.get(), std::forward<Args>(args)...);
            return object.release();
        }